

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

void printf_test(void)

{
  ulong *puVar1;
  bitset_container_t *v;
  int iVar2;
  ulong uVar3;
  
  v = bitset_container_create();
  _assert_true((unsigned_long)v,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x36);
  puVar1 = v->words;
  uVar3 = *puVar1;
  iVar2 = (int)(((uVar3 | 2) ^ uVar3) >> 1) + v->cardinality;
  v->cardinality = iVar2;
  *puVar1 = uVar3 | 2;
  iVar2 = (int)(((uVar3 | 6) ^ uVar3) >> 2) + iVar2;
  v->cardinality = iVar2;
  *puVar1 = uVar3 | 6;
  iVar2 = (int)(((uVar3 | 0xe) ^ uVar3) >> 3) + iVar2;
  v->cardinality = iVar2;
  *puVar1 = uVar3 | 0xe;
  iVar2 = (int)((uVar3 ^ (uVar3 | 0x40e)) >> 10) + iVar2;
  v->cardinality = iVar2;
  *puVar1 = uVar3 | 0x40e;
  uVar3 = puVar1[0x9c] | 0x10000;
  v->cardinality = ((uint)(puVar1[0x9c] >> 0x10) ^ (uint)(uVar3 >> 0x10)) + iVar2;
  puVar1[0x9c] = uVar3;
  bitset_container_printf(v);
  putchar(10);
  bitset_container_free(v);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    bitset_container_set(B, 1U);
    bitset_container_set(B, 2U);
    bitset_container_set(B, 3U);
    bitset_container_set(B, 10U);
    bitset_container_set(B, 10000U);

    bitset_container_printf(B);  // does it crash?
    printf("\n");

    bitset_container_free(B);
}